

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          StringRef depsPath,MemoryBuffer *input,bool ignoreSubsequentOutputs)

{
  StringRef data;
  MakefileDepsParser local_c0;
  char *local_a0;
  size_t local_98;
  void *local_90;
  void *local_88;
  undefined1 local_80 [8];
  DepsActions actions;
  bool ignoreSubsequentOutputs_local;
  MemoryBuffer *input_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  ShellCommand *this_local;
  TaskInterface ti_local;
  
  local_88 = ti.ctx;
  local_90 = ti.impl;
  actions._63_1_ = ignoreSubsequentOutputs;
  local_a0 = depsPath.Data;
  local_98 = depsPath.Length;
  processMakefileDiscoveredDependencies(llbuild::buildsystem::BuildSystem&,llbuild::core::
  TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::MemoryBuffer*,bool)::
  DepsActions::DepsActions(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::
  buildsystem::ShellCommand*,llvm::StringRef_(local_80,system,ti,this,depsPath);
  data = llvm::MemoryBuffer::getBuffer(input);
  core::MakefileDepsParser::MakefileDepsParser
            (&local_c0,data,(ParseActions *)local_80,(bool)(actions._63_1_ & 1));
  core::MakefileDepsParser::parse(&local_c0);
  processMakefileDiscoveredDependencies::DepsActions::~DepsActions((DepsActions *)local_80);
  return (int)actions.depsPath.Length == 0;
}

Assistant:

bool ShellCommand::processMakefileDiscoveredDependencies(BuildSystem& system,
                                                         TaskInterface ti,
                                                         QueueJobContext* context,
                                                         StringRef depsPath,
                                                         llvm::MemoryBuffer* input,
                                                         bool ignoreSubsequentOutputs) {
  // Parse the output.
  //
  // We just ignore the rule, and add any dependency that we encounter in the
  // file.
  struct DepsActions : public core::MakefileDepsParser::ParseActions {
    BuildSystem& system;
    TaskInterface ti;
    ShellCommand* command;
    StringRef depsPath;
    unsigned numErrors{0};

    DepsActions(BuildSystem& system, TaskInterface ti,
                ShellCommand* command, StringRef depsPath)
        : system(system), ti(ti), command(command), depsPath(depsPath) {}

    virtual void error(StringRef message, uint64_t position) override {
      std::string msg;
      raw_string_ostream msgStream(msg);
      msgStream << "error reading dependency file '" << depsPath << "': "
          << message << " at position " << position;
      system.getDelegate().commandHadError(command, msgStream.str());
      ++numErrors;
    }

    virtual void actOnRuleDependency(StringRef dependency,
                                     StringRef unescapedWord) override {
      if (llvm::sys::path::is_absolute(unescapedWord)) {
        ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
        return;
      }

      // Generate absolute path
      //
      // NOTE: This is making the assumption that relative paths coming in a
      // dependency file are in relation to the explictly set working
      // directory, or the current working directory when it has not been set.
      SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
      llvm::sys::path::append(absPath, unescapedWord);
      llvm::sys::fs::make_absolute(absPath);

      ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
      system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
    }

    virtual void actOnRuleStart(StringRef name,
                                const StringRef unescapedWord) override {}

    virtual void actOnRuleEnd() override {}
  };

  DepsActions actions(system, ti, this, depsPath);
  core::MakefileDepsParser(input->getBuffer(), actions, ignoreSubsequentOutputs).parse();
  return actions.numErrors == 0;
}